

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx *dctx,void *dict,size_t dictSize)

{
  void *pvVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  
  dctx->expected = (ulong)(dctx->format != ZSTD_f_zstd1_magicless) * 4 + 1;
  dctx->stage = ZSTDds_getFrameHeaderSize;
  dctx->decodedSize = 0;
  dctx->previousDstEnd = (void *)0x0;
  dctx->prefixStart = (void *)0x0;
  dctx->virtualStart = (void *)0x0;
  dctx->dictEnd = (void *)0x0;
  (dctx->entropy).hufTable[0] = 0xc00000c;
  dctx->litEntropy = 0;
  dctx->fseEntropy = 0;
  dctx->dictID = 0;
  (dctx->entropy).rep[0] = 1;
  (dctx->entropy).rep[1] = 4;
  (dctx->entropy).rep[2] = 8;
  dctx->LLTptr = (dctx->entropy).LLTable;
  dctx->MLTptr = (dctx->entropy).MLTable;
  dctx->OFTptr = (dctx->entropy).OFTable;
  dctx->HUFptr = (dctx->entropy).hufTable;
  if (dictSize != 0 && dict != (void *)0x0) {
    pvVar1 = (void *)0x0;
    pvVar4 = (void *)0x0;
    pvVar3 = dict;
    if (7 < dictSize) {
      pvVar1 = (void *)0x0;
      pvVar4 = (void *)0x0;
      if (*dict == -0x13cf5bc9) {
        dctx->dictID = *(U32 *)((long)dict + 4);
        sVar2 = ZSTD_loadDEntropy(&dctx->entropy,dict,dictSize);
        if (0xffffffffffffff88 < sVar2) {
          return 0xffffffffffffffe2;
        }
        pvVar3 = (void *)(sVar2 + (long)dict);
        dctx->litEntropy = 1;
        dctx->fseEntropy = 1;
        pvVar4 = dctx->previousDstEnd;
        pvVar1 = dctx->prefixStart;
      }
    }
    dctx->dictEnd = pvVar4;
    dctx->virtualStart = (void *)(((long)pvVar1 - (long)pvVar4) + (long)pvVar3);
    dctx->prefixStart = pvVar3;
    dctx->previousDstEnd = (void *)((long)dict + dictSize);
  }
  return 0;
}

Assistant:

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx* dctx, const void* dict, size_t dictSize)
{
    FORWARD_IF_ERROR( ZSTD_decompressBegin(dctx) );
    if (dict && dictSize)
        RETURN_ERROR_IF(
            ZSTD_isError(ZSTD_decompress_insertDictionary(dctx, dict, dictSize)),
            dictionary_corrupted);
    return 0;
}